

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O2

void __thiscall Assimp::Blender::DNA::DumpToFile(DNA *this)

{
  pointer pSVar1;
  pointer pFVar2;
  Logger *pLVar3;
  ostream *poVar4;
  pointer pSVar5;
  pointer pFVar6;
  ofstream f;
  byte abStack_210 [480];
  
  ::std::ofstream::ofstream(&f,"dna.txt",_S_out);
  if ((abStack_210[*(long *)(_f + -0x18)] & 5) == 0) {
    poVar4 = ::std::operator<<((ostream *)&f,"Field format: type name offset size");
    ::std::operator<<(poVar4,"\n");
    poVar4 = ::std::operator<<((ostream *)&f,"Structure format: name size");
    ::std::operator<<(poVar4,"\n");
    pSVar1 = (this->structures).
             super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
             super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar5 = (this->structures).
                  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                  .
                  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar1; pSVar5 = pSVar5 + 1)
    {
      poVar4 = ::std::operator<<((ostream *)&f,(string *)pSVar5);
      poVar4 = ::std::operator<<(poVar4," ");
      poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      ::std::operator<<(poVar4,"\n\n");
      pFVar2 = (pSVar5->fields).
               super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
               super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pFVar6 = (pSVar5->fields).
                    super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
                    super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                    ._M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar2; pFVar6 = pFVar6 + 1
          ) {
        poVar4 = ::std::operator<<((ostream *)&f,"\t");
        poVar4 = ::std::operator<<(poVar4,(string *)&pFVar6->type);
        poVar4 = ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<(poVar4,(string *)pFVar6);
        poVar4 = ::std::operator<<(poVar4," ");
        poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = ::std::operator<<(poVar4," ");
        poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        ::std::operator<<(poVar4,"\n");
      }
      ::std::operator<<((ostream *)&f,"\n");
    }
    ::std::ostream::flush();
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"BlenderDNA: Dumped dna to dna.txt");
  }
  else {
    pLVar3 = DefaultLogger::get();
    Logger::error(pLVar3,"Could not dump dna to dna.txt");
  }
  ::std::ofstream::~ofstream(&f);
  return;
}

Assistant:

void DNA :: DumpToFile()
{
    // we don't bother using the VFS here for this is only for debugging.
    // (and all your bases are belong to us).

    std::ofstream f("dna.txt");
    if (f.fail()) {
        ASSIMP_LOG_ERROR("Could not dump dna to dna.txt");
        return;
    }
    f << "Field format: type name offset size" << "\n";
    f << "Structure format: name size" << "\n";

    for(const Structure& s : structures) {
        f << s.name << " " << s.size << "\n\n";
        for(const Field& ff : s.fields) {
            f << "\t" << ff.type << " " << ff.name << " " << ff.offset << " " << ff.size << "\n";
        }
        f << "\n";
    }
    f << std::flush;

    ASSIMP_LOG_INFO("BlenderDNA: Dumped dna to dna.txt");
}